

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_1a3010::AddCopyInfo(VmModule *module,VmInstruction *inst)

{
  VmValue *node;
  VmConstant *node_00;
  bool bVar1;
  VmValue **ppVVar2;
  VmConstant *pVVar3;
  VmConstant *pVVar4;
  VmConstant *pVVar5;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  VmConstant *loadAddress;
  VmConstant *loadOffset;
  VmValue *loadPointer;
  LoadStoreInfo info;
  VmConstant *storeAddress;
  VmConstant *storeOffset;
  VmValue *storePointer;
  VmInstruction *inst_local;
  VmModule *module_local;
  
  ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
  node = *ppVVar2;
  ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,1);
  pVVar3 = getType<VmConstant>(*ppVVar2);
  info._80_8_ = getType<VmConstant>(node);
  if ((VmConstant *)info._80_8_ == (VmConstant *)0x0) {
    ClearLoadStoreInfoAliasing(module,inst);
  }
  else if (((VmConstant *)info._80_8_)->container != (VariableData *)0x0) {
    if (pVVar3->iValue != 0) {
      __assert_fail("storeOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x617,"void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)");
    }
    VmModule::LoadStoreInfo::LoadStoreInfo((LoadStoreInfo *)&loadPointer);
    info.storeInst = inst;
    info.copyInst._0_4_ = GetAccessSize(inst);
    info.loadOffset = (VmConstant *)info._80_8_;
    ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,2);
    node_00 = (VmConstant *)*ppVVar2;
    ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,3);
    pVVar4 = getType<VmConstant>(*ppVVar2);
    pVVar5 = getType<VmConstant>((VmValue *)node_00);
    if ((pVVar5 != (VmConstant *)0x0) &&
       (info._24_8_ = pVVar5, node_00 = info.loadAddress, pVVar4 = (VmConstant *)info.loadPointer,
       pVVar3->iValue != 0)) {
      __assert_fail("storeOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x627,"void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)");
    }
    info.loadPointer = &pVVar4->super_VmValue;
    info.loadAddress = node_00;
    ClearLoadStoreInfo(module,*(VariableData **)(info._80_8_ + 200),*(uint *)(info._80_8_ + 0x98),
                       (uint)info.copyInst);
    if ((info._24_8_ != 0) || (local_a1 = 1, info.loadAddress != (VmConstant *)0x0)) {
      local_a2 = 0;
      if ((info._24_8_ != 0) && (local_a2 = 0, *(long *)(info._24_8_ + 200) != 0)) {
        bVar1 = HasAddressTaken(*(VariableData **)(info._24_8_ + 200));
        local_a2 = bVar1 ^ 0xff;
      }
      local_a1 = local_a2;
    }
    info.storeOffset._0_1_ = local_a1 & 1;
    if ((info.loadOffset != (VmConstant *)0x0) ||
       (local_a3 = 1, info.storeAddress != (VmConstant *)0x0)) {
      local_a4 = 0;
      if ((info.loadOffset != (VmConstant *)0x0) &&
         (local_a4 = 0, (info.loadOffset)->container != (VariableData *)0x0)) {
        bVar1 = HasAddressTaken((info.loadOffset)->container);
        local_a4 = bVar1 ^ 0xff;
      }
      local_a3 = local_a4;
    }
    info.storeOffset._1_1_ = local_a3 & 1;
    SmallArray<VmModule::LoadStoreInfo,_32U>::push_back
              (&module->loadStoreInfo,(LoadStoreInfo *)&loadPointer);
  }
  return;
}

Assistant:

void AddCopyInfo(VmModule *module, VmInstruction* inst)
	{
		VmValue *storePointer = inst->arguments[0];
		VmConstant *storeOffset = getType<VmConstant>(inst->arguments[1]);

		if(VmConstant *storeAddress = getType<VmConstant>(storePointer))
		{
			if(!storeAddress->container)
				return;

			assert(storeOffset->iValue == 0);
			(void)storeOffset;

			VmModule::LoadStoreInfo info;

			info.copyInst = inst;

			info.accessSize = GetAccessSize(inst);

			info.storeAddress = storeAddress;

			VmValue *loadPointer = inst->arguments[2];
			VmConstant *loadOffset = getType<VmConstant>(inst->arguments[3]);

			if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
			{
				assert(storeOffset->iValue == 0);
				(void)storeOffset;

				info.loadAddress = loadAddress;
			}
			else
			{
				info.loadPointer = loadPointer;
				info.loadOffset = loadOffset;
			}

			// Remove previous loads and stores to this address range
			ClearLoadStoreInfo(module, storeAddress->container, unsigned(storeAddress->iValue), info.accessSize);

			info.noLoadOrNoContainerAlias = !(info.loadAddress || info.loadPointer) || (info.loadAddress && info.loadAddress->container && !HasAddressTaken(info.loadAddress->container));
			info.noStoreOrNoContainerAlias = !(info.storeAddress || info.storePointer) || (info.storeAddress && info.storeAddress->container && !HasAddressTaken(info.storeAddress->container));

			module->loadStoreInfo.push_back(info);
		}
		else
		{
			ClearLoadStoreInfoAliasing(module, inst);
		}
	}